

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O1

QPDFObjectHandle __thiscall
QPDFPageObjectHelper::getTrimBox
          (QPDFPageObjectHelper *this,bool copy_if_shared,bool copy_if_fallback)

{
  undefined1 in_CL;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined7 in_register_00000031;
  function<QPDFObjectHandle_()> *get_fallback;
  QPDFObjectHandle QVar2;
  string *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  long *local_50 [2];
  long local_40 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  get_fallback = (function<QPDFObjectHandle_()> *)
                 (CONCAT71(in_register_00000011,copy_if_fallback) & 0xffffffff);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/TrimBox","");
  uStack_70 = (ulong)CONCAT11(in_CL,(char)get_fallback);
  pcStack_60 = std::
               _Function_handler<QPDFObjectHandle_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFPageObjectHelper.cc:291:9)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<QPDFObjectHandle_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFPageObjectHelper.cc:291:9)>
             ::_M_manager;
  local_78 = (string *)CONCAT71(in_register_00000031,copy_if_shared);
  QVar2 = getAttribute(this,(string *)CONCAT71(in_register_00000031,copy_if_shared),
                       SUB81((string *)local_50,0),get_fallback,SUB81(&local_78,0));
  _Var1._M_pi = QVar2.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
    _Var1._M_pi = extraout_RDX;
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    _Var1._M_pi = extraout_RDX_00;
  }
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageObjectHelper::getTrimBox(bool copy_if_shared, bool copy_if_fallback)
{
    return getAttribute(
        "/TrimBox",
        copy_if_shared,
        [this, copy_if_shared, copy_if_fallback]() {
            return this->getCropBox(copy_if_shared, copy_if_fallback);
        },
        copy_if_fallback);
}